

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  cmMakefile *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  ManagedType MVar5;
  mapped_type *pmVar6;
  cmLinkInterface *pcVar7;
  cmValue cVar8;
  string prop_1;
  string prop;
  string value;
  allocator<char> local_b9;
  ImportPropertyMap *local_b8;
  string local_b0;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  this_00 = target->Makefile;
  local_b8 = properties;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 != SHARED_LIBRARY) {
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 != MODULE_LIBRARY) goto LAB_0039b357;
  }
  bVar3 = cmGeneratorTarget::IsDLLPlatform(target);
  if (!bVar3) {
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = (char *)0x0;
    local_90[0x10] = '\0';
    local_60._0_8_ = local_60 + 0x10;
    local_60._8_8_ = (pointer)0x0;
    local_60[0x10] = '\0';
    bVar3 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_b9);
      bVar3 = cmMakefile::IsOn(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar3) {
        (*this->_vptr_cmExportFileGenerator[0x14])(&local_b0,this,target,config);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::assign(local_90);
      cmGeneratorTarget::GetSOName(&local_b0,target,config);
      std::__cxx11::string::append((string *)local_60);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      std::__cxx11::string::assign(local_90);
      std::__cxx11::string::assign(local_60);
    }
    std::__cxx11::string::append((string *)local_90);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,(key_type *)local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_90);
  }
LAB_0039b357:
  pcVar7 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (pcVar7 != (cmLinkInterface *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator<char> *)local_60);
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,(string *)local_90,&pcVar7->Languages,local_b8,No);
    std::__cxx11::string::~string((string *)local_90);
    pbVar1 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator<char> *)local_60);
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,(string *)local_90,&pcVar7->SharedDeps,local_b8,Yes);
    std::__cxx11::string::~string((string *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->MissingTargets,(long)pbVar1 - (long)pbVar2 >> 5);
    if (pcVar7->Multiplicity != 0) {
      local_90._0_8_ = (pointer)0x24;
      local_90._8_8_ = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
      local_60._8_8_ = (suffix->_M_dataplus)._M_p;
      local_60._0_8_ = suffix->_M_string_length;
      cmStrCat<>(&local_b0,(cmAlphaNum *)local_90,(cmAlphaNum *)local_60);
      std::__cxx11::to_string((string *)local_90,pcVar7->Multiplicity);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b8,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  MVar5 = cmGeneratorTarget::GetManagedType(target,config);
  if (MVar5 != Native) {
    local_90._0_8_ = (pointer)0x20;
    local_90._8_8_ = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    local_60._8_8_ = (suffix->_M_dataplus)._M_p;
    local_60._0_8_ = suffix->_M_string_length;
    cmStrCat<>(&local_b0,(cmAlphaNum *)local_90,(cmAlphaNum *)local_60);
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = (char *)0x0;
    local_90[0x10] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"COMMON_LANGUAGE_RUNTIME",&local_b9);
    cVar8 = cmGeneratorTarget::GetProperty(target,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    if (cVar8.Value == (string *)0x0) {
      bVar3 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar3) {
        std::__cxx11::string::assign(local_90);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_90);
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,&local_b0);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LANGUAGES", iface->Languages,
      properties, ImportLinkPropertyTargetNames::No);

    // Export IMPORTED_LINK_DEPENDENT_LIBRARIES to help consuming linkers
    // find private dependencies of shared libraries.
    std::size_t oldMissingTargetsSize = this->MissingTargets.size();
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_DEPENDENT_LIBRARIES", iface->SharedDeps,
      properties, ImportLinkPropertyTargetNames::Yes);
    // Avoid enforcing shared library private dependencies as public package
    // dependencies by ignoring missing targets added for them.
    this->MissingTargets.resize(oldMissingTargetsSize);

    if (iface->Multiplicity > 0) {
      std::string prop =
        cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
      properties[prop] = std::to_string(iface->Multiplicity);
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = cmStrCat("IMPORTED_COMMON_LANGUAGE_RUNTIME", suffix);
    std::string propval;
    if (cmValue p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = *p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}